

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

Rpo_TtStore_t * Abc_TruthStoreAlloc2(int nVars,int nFuncs,word *pBuffer)

{
  Rpo_TtStore_t *pRVar1;
  word **ppwVar2;
  int local_28;
  int local_24;
  int i;
  Rpo_TtStore_t *p;
  word *pBuffer_local;
  int nFuncs_local;
  int nVars_local;
  
  pRVar1 = (Rpo_TtStore_t *)malloc(0x18);
  pRVar1->nVars = nVars;
  if (nVars < 7) {
    local_28 = 1;
  }
  else {
    local_28 = 1 << ((char)nVars - 6U & 0x1f);
  }
  pRVar1->nWords = local_28;
  pRVar1->nFuncs = nFuncs;
  ppwVar2 = (word **)malloc((long)pRVar1->nFuncs << 3);
  pRVar1->pFuncs = ppwVar2;
  *pRVar1->pFuncs = pBuffer;
  for (local_24 = 1; local_24 < pRVar1->nFuncs; local_24 = local_24 + 1) {
    pRVar1->pFuncs[local_24] = pRVar1->pFuncs[local_24 + -1] + pRVar1->nWords;
  }
  return pRVar1;
}

Assistant:

Abc_TtStore_t * Abc_TruthStoreAlloc2( int nVars, int nFuncs, word * pBuffer )
{
    Abc_TtStore_t * p;
    int i;
    p = (Abc_TtStore_t *)malloc( sizeof(Abc_TtStore_t) );
    p->nVars  =  nVars;
    p->nWords = (nVars < 7) ? 1 : (1 << (nVars-6));
    p->nFuncs =  nFuncs;
    // alloc storage for 'nFuncs' truth tables as one chunk of memory
    p->pFuncs = (word **)malloc( sizeof(word *) * p->nFuncs );
    // assign and clean the truth table storage
    p->pFuncs[0] = pBuffer;
    // split it up into individual truth tables
    for ( i = 1; i < p->nFuncs; i++ )
        p->pFuncs[i] = p->pFuncs[i-1] + p->nWords;
    return p;
}